

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O3

void __thiscall
cppjieba::HMMSegment::Viterbi
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *status)

{
  size_type __n;
  pointer puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  const_iterator cVar3;
  unsigned_long uVar4;
  long lVar5;
  HMMModel *pHVar6;
  uint uVar7;
  long lVar8;
  const_iterator pRVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  size_t y;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  vector<double,_std::allocator<double>_> weight;
  vector<int,_std::allocator<int>_> path;
  Rune local_94;
  double local_90;
  HMMSegment *local_88;
  ulong local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  size_type local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  const_iterator local_38;
  
  lVar5 = (long)end - (long)begin >> 2;
  local_80 = lVar5 * -0x3333333333333333;
  __n = lVar5 * 0x3333333333333334;
  local_88 = this;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__n,(allocator_type *)&local_78);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,__n,(allocator_type *)&local_94);
  lVar5 = 0;
  lVar14 = 0;
  do {
    local_90 = local_88->model_->startProb[lVar14];
    local_94 = begin->rune;
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(local_88->model_->emitProbVec).
                    super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14]->_M_h,&local_94);
    uVar11 = local_80;
    dVar17 = -3.14e+100;
    if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>._M_cur !=
        (__node_type *)0x0) {
      dVar17 = *(double *)
                ((long)cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>
                       ._M_cur + 0x10);
    }
    *(double *)
     ((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar5 * 2) = local_90 + dVar17;
    *(undefined4 *)
     ((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar5) = 0xffffffff;
    lVar14 = lVar14 + 1;
    lVar5 = lVar5 + __n;
  } while (lVar14 != 4);
  local_48 = __n;
  local_40 = status;
  if (1 < local_80) {
    pHVar6 = local_88->model_;
    uVar15 = 1;
    local_90 = 0.0;
    local_38 = begin;
    do {
      pRVar9 = local_38 + uVar15;
      lVar14 = 0x28;
      lVar5 = 0;
      do {
        lVar8 = lVar5 * local_80 + uVar15;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] = -3.14e+100;
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = 1;
        local_94 = pRVar9->rune;
        cVar3 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(pHVar6->emitProbVec).
                        super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar5]->_M_h,&local_94);
        dVar17 = -3.14e+100;
        if (cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>._M_cur !=
            (__node_type *)0x0) {
          dVar17 = *(double *)
                    ((long)cVar3.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>.
                           _M_cur + 0x10);
        }
        pHVar6 = local_88->model_;
        dVar18 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
        pdVar10 = (double *)
                  ((long)local_90 +
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
        pdVar12 = (double *)(pHVar6->statMap + lVar14);
        lVar13 = 0;
        do {
          dVar19 = *pdVar10 + *pdVar12 + dVar17;
          if (dVar18 < dVar19) {
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8] = dVar19;
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar8] = (int)lVar13;
            dVar18 = dVar19;
          }
          lVar13 = lVar13 + 1;
          pdVar10 = pdVar10 + uVar11;
          pdVar12 = pdVar12 + 4;
        } while (lVar13 != 4);
        lVar5 = lVar5 + 1;
        lVar14 = lVar14 + 8;
      } while (lVar5 != 4);
      uVar15 = uVar15 + 1;
      local_90 = (double)((long)local_90 + 8);
    } while (uVar15 != local_80);
  }
  pvVar2 = local_40;
  uVar11 = local_80;
  local_88 = (HMMSegment *)
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_80 * 2 + -1];
  local_90 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_80 * 4 + -1];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_40,local_80);
  uVar7 = (int)uVar11 - 1;
  if (-1 < (int)uVar7) {
    uVar4 = (ulong)((double)local_88 < local_90) * 2 + 1;
    puVar1 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (ulong)(uVar7 & 0x7fffffff);
    do {
      puVar1[uVar11] = uVar4;
      uVar4 = (unsigned_long)
              *(int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar11 * 4 + uVar4 * local_48);
      bVar16 = uVar11 != 0;
      uVar11 = uVar11 - 1;
    } while (bVar16);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Viterbi(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<size_t>& status) const {
    size_t Y = HMMModel::STATUS_SUM;
    size_t X = end - begin;

    size_t XYSize = X * Y;
    size_t now, old, stat;
    double tmp, endE, endS;

    vector<int> path(XYSize);
    vector<double> weight(XYSize);

    //start
    for (size_t y = 0; y < Y; y++) {
      weight[0 + y * X] = model_->startProb[y] + model_->GetEmitProb(model_->emitProbVec[y], begin->rune, MIN_DOUBLE);
      path[0 + y * X] = -1;
    }

    double emitProb;

    for (size_t x = 1; x < X; x++) {
      for (size_t y = 0; y < Y; y++) {
        now = x + y*X;
        weight[now] = MIN_DOUBLE;
        path[now] = HMMModel::E; // warning
        emitProb = model_->GetEmitProb(model_->emitProbVec[y], (begin+x)->rune, MIN_DOUBLE);
        for (size_t preY = 0; preY < Y; preY++) {
          old = x - 1 + preY * X;
          tmp = weight[old] + model_->transProb[preY][y] + emitProb;
          if (tmp > weight[now]) {
            weight[now] = tmp;
            path[now] = preY;
          }
        }
      }
    }

    endE = weight[X-1+HMMModel::E*X];
    endS = weight[X-1+HMMModel::S*X];
    stat = 0;
    if (endE >= endS) {
      stat = HMMModel::E;
    } else {
      stat = HMMModel::S;
    }

    status.resize(X);
    for (int x = X -1 ; x >= 0; x--) {
      status[x] = stat;
      stat = path[x + stat*X];
    }
  }